

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Module::Module(Module *this,Store *param_1,ModuleDesc *desc)

{
  bool bVar1;
  vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *this_00;
  ImportType *__args;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *this_01;
  reference __args_00;
  ExportDesc *export_;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *__range2_1;
  ImportDesc *import;
  iterator __end2;
  iterator __begin2;
  vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *__range2;
  ModuleDesc *desc_local;
  Store *param_1_local;
  Module *this_local;
  
  Object::Object(&this->super_Object,Module);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Module_004b2998;
  ModuleDesc::ModuleDesc(&this->desc_,desc);
  std::vector<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>::vector
            (&this->import_types_);
  std::vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>::vector
            (&this->export_types_);
  this_00 = &(this->desc_).imports;
  __end2 = std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::begin
                     (this_00);
  import = (ImportDesc *)
           std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::end
                     (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
                                *)&import);
    if (!bVar1) break;
    __args = &__gnu_cxx::
              __normal_iterator<wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
              ::operator*(&__end2)->type;
    std::vector<wabt::interp::ImportType,std::allocator<wabt::interp::ImportType>>::
    emplace_back<wabt::interp::ImportType&>
              ((vector<wabt::interp::ImportType,std::allocator<wabt::interp::ImportType>> *)
               &this->import_types_,__args);
    __gnu_cxx::
    __normal_iterator<wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
    ::operator++(&__end2);
  }
  this_01 = &(this->desc_).exports;
  __end2_1 = std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::begin
                       (this_01);
  export_ = (ExportDesc *)
            std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::end
                      (this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                        *)&export_);
    if (!bVar1) break;
    __args_00 = __gnu_cxx::
                __normal_iterator<wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                ::operator*(&__end2_1);
    std::vector<wabt::interp::ExportType,std::allocator<wabt::interp::ExportType>>::
    emplace_back<wabt::interp::ExportType&>
              ((vector<wabt::interp::ExportType,std::allocator<wabt::interp::ExportType>> *)
               &this->export_types_,&__args_00->type);
    __gnu_cxx::
    __normal_iterator<wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

Module::Module(Store&, ModuleDesc desc)
    : Object(skind), desc_(std::move(desc)) {
  for (auto&& import: desc_.imports) {
    import_types_.emplace_back(import.type);
  }

  for (auto&& export_: desc_.exports) {
    export_types_.emplace_back(export_.type);
  }
}